

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.h
# Opt level: O0

cmCommand * __thiscall cmVariableWatchCommand::Clone(cmVariableWatchCommand *this)

{
  cmVariableWatchCommand *this_00;
  cmVariableWatchCommand *this_local;
  
  this_00 = (cmVariableWatchCommand *)operator_new(0x60);
  cmVariableWatchCommand(this_00);
  return &this_00->super_cmCommand;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmVariableWatchCommand; }